

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

void __thiscall
ktx::CommandCreate::checkSpecsMatch
          (CommandCreate *this,ImageInput *currentFile,ImageSpec *firstSpec)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  khr_df_transfer_e transfer;
  khr_df_transfer_e transfer_00;
  khr_df_transfer_e transfer_01;
  khr_df_transfer_e transfer_02;
  khr_df_transfer_e transfer_03;
  khr_df_primaries_e primaries;
  khr_df_primaries_e primaries_00;
  khr_df_primaries_e primaries_01;
  khr_df_primaries_e primaries_02;
  khr_df_primaries_e primaries_03;
  Reporter *pRVar7;
  Origin *rhs;
  string currentGamma;
  string firstGamma;
  allocator<char> local_31;
  uint *puVar6;
  
  iVar4 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
  puVar6 = (uint *)CONCAT44(extraout_var,iVar4);
  if (((*(uint *)&(firstSpec->formatDesc).basic ^ *puVar6) & 0xff0000) != 0) {
    if ((this->options).super_OptionsCreate.assignTF.
        super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
        super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
      iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      toString_abi_cxx11_(&currentGamma,(ktx *)(ulong)*(byte *)((long)puVar6 + 2),transfer);
      toString_abi_cxx11_(&firstGamma,(ktx *)(ulong)(byte)(firstSpec->formatDesc).basic.field_0x2,
                          transfer_00);
      Reporter::
      warning<char_const(&)[152],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                (&(this->super_Command).super_Reporter,
                 (char (*) [152])
                 "Input image \"{}\" has different transfer function ({}) than the first image ({}) but will be treated identically as specified by the --assign-tf option."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_00,iVar4),&currentGamma,&firstGamma);
    }
    else {
      bVar3 = (this->options).super_OptionsCreate.convertTF.
              super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_transfer_e>._M_engaged;
      pRVar7 = &(this->super_Command).super_Reporter;
      iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      if (bVar3 == true) {
        toString_abi_cxx11_(&currentGamma,(ktx *)(ulong)*(byte *)((long)puVar6 + 2),transfer_01);
        toString_abi_cxx11_(&firstGamma,(ktx *)(ulong)(byte)(firstSpec->formatDesc).basic.field_0x2,
                            transfer_02);
        Reporter::
        warning<char_const(&)[214],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (pRVar7,(char (*) [214])
                          "Input image \"{}\" has different transfer function ({}) than the first image ({}) and thus will go through different transfer function conversion to the target transfer function specified by the --convert-tf option."
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(extraout_var_01,iVar4),&currentGamma,&firstGamma);
      }
      else {
        toString_abi_cxx11_(&currentGamma,(ktx *)(ulong)*(byte *)((long)puVar6 + 2),transfer_01);
        toString_abi_cxx11_(&firstGamma,(ktx *)(ulong)(byte)(firstSpec->formatDesc).basic.field_0x2,
                            transfer_03);
        Reporter::
        fatal<char_const(&)[154],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (pRVar7,INVALID_FILE,
                   (char (*) [154])
                   "Input image \"{}\" has different transfer function ({}) than the first image ({}). Use --assign-tf or --convert-tf to specify handling and stop this error."
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(extraout_var_01,iVar4),&currentGamma,&firstGamma);
      }
    }
    std::__cxx11::string::~string((string *)&firstGamma);
    std::__cxx11::string::~string((string *)&currentGamma);
  }
  fVar2 = (float)puVar6[6];
  pfVar1 = &(firstSpec->formatDesc).extended.oeGamma;
  if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
    if ((fVar2 != -1.0) || (NAN(fVar2))) {
      std::__cxx11::to_string(&currentGamma,fVar2);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentGamma,"no gamma",(allocator<char> *)&firstGamma);
    }
    fVar2 = (firstSpec->formatDesc).extended.oeGamma;
    if ((fVar2 != -1.0) || (NAN(fVar2))) {
      std::__cxx11::to_string(&firstGamma,fVar2);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&firstGamma,"no gamma",&local_31)
      ;
    }
    if ((this->options).super_OptionsCreate.assignTF.
        super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
        super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
      iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      Reporter::
      warning<char_const(&)[140],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
                (&(this->super_Command).super_Reporter,
                 (char (*) [140])
                 "Input image \"{}\" has different gamma ({}) than the first image ({}) but will be treated identically as specified by the --assign-tf option."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_02,iVar4),&currentGamma,&firstGamma);
    }
    else if ((this->options).super_OptionsCreate.convertTF.
             super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
             super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
      iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      Reporter::
      warning<char_const(&)[202],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
                (&(this->super_Command).super_Reporter,
                 (char (*) [202])
                 "Input image \"{}\" has different gamma ({}) than the first image ({}) and thus will go through different transfer function conversion to the target transfer function specified by the --convert-tf option."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_03,iVar4),&currentGamma,&firstGamma);
    }
    else {
      iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      Reporter::
      fatal<char_const(&)[142],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
                (&(this->super_Command).super_Reporter,INVALID_FILE,
                 (char (*) [142])
                 "Input image \"{}\" has different gamma ({}) than the first image ({}). Use --assign-tf or --convert-tf to specify handling and stop this error."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_04,iVar4),&currentGamma,&firstGamma);
    }
    std::__cxx11::string::~string((string *)&firstGamma);
    std::__cxx11::string::~string((string *)&currentGamma);
  }
  if (((*(uint *)&(firstSpec->formatDesc).basic ^ *puVar6) & 0xff00) != 0) {
    if ((this->options).super_OptionsCreate.assignPrimaries.
        super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
        super__Optional_payload_base<_khr_df_primaries_e>._M_engaged == true) {
      iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      toString_abi_cxx11_(&currentGamma,(ktx *)(ulong)*(byte *)((long)puVar6 + 1),primaries);
      toString_abi_cxx11_(&firstGamma,(ktx *)(ulong)(byte)(firstSpec->formatDesc).basic.field_0x1,
                          primaries_00);
      Reporter::
      warning<char_const(&)[151],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                (&(this->super_Command).super_Reporter,
                 (char (*) [151])
                 "Input image \"{}\" has different primaries ({}) than the first image ({}) but will be treated identically as specified by the --assign-primaries option."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_05,iVar4),&currentGamma,&firstGamma);
    }
    else {
      bVar3 = (this->options).super_OptionsCreate.convertPrimaries.
              super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_primaries_e>._M_engaged;
      pRVar7 = &(this->super_Command).super_Reporter;
      iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      if (bVar3 == true) {
        toString_abi_cxx11_(&currentGamma,(ktx *)(ulong)*(byte *)((long)puVar6 + 1),primaries_01);
        toString_abi_cxx11_(&firstGamma,(ktx *)(ulong)(byte)(firstSpec->formatDesc).basic.field_0x1,
                            primaries_02);
        Reporter::
        warning<char_const(&)[197],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (pRVar7,(char (*) [197])
                          "Input image \"{}\" has different primaries ({}) than the first image ({}) and thus will go through different primaries conversion to the target primaries specified by the --convert-primaries option."
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(extraout_var_06,iVar4),&currentGamma,&firstGamma);
      }
      else {
        toString_abi_cxx11_(&currentGamma,(ktx *)(ulong)*(byte *)((long)puVar6 + 1),primaries_01);
        toString_abi_cxx11_(&firstGamma,(ktx *)(ulong)(byte)(firstSpec->formatDesc).basic.field_0x1,
                            primaries_03);
        Reporter::
        fatal<char_const(&)[160],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (pRVar7,INVALID_FILE,
                   (char (*) [160])
                   "Input image \"{}\" has different primaries ({}) than the first image ({}). Use --assign-primaries or --convert-primaries to specify handling and stop this error."
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(extraout_var_06,iVar4),&currentGamma,&firstGamma);
      }
    }
    std::__cxx11::string::~string((string *)&firstGamma);
    std::__cxx11::string::~string((string *)&currentGamma);
  }
  if (puVar6[4] != (firstSpec->formatDesc).extended.channelCount) {
    iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
    Reporter::warning<char_const(&)[71],std::__cxx11::string_const&>
              (&(this->super_Command).super_Reporter,
               (char (*) [71])
               "Input image \"{}\" has a different component count than the first image.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var_07,iVar4));
  }
  iVar4 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
  rhs = &firstSpec->imageOrigin;
  bVar3 = ::operator!=((Origin *)(CONCAT44(extraout_var_08,iVar4) + 0x7c),rhs);
  if (bVar3) {
    if ((this->options).super_OptionsCreate.assignTexcoordOrigin.
        super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
        super__Optional_payload_base<ImageSpec::Origin>._M_engaged == true) {
      iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      iVar5 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
      ::toString_abi_cxx11_(&currentGamma,(Origin *)(CONCAT44(extraout_var_10,iVar5) + 0x7c));
      ::toString_abi_cxx11_(&firstGamma,rhs);
      Reporter::
      warning<char_const(&)[163],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                (&(this->super_Command).super_Reporter,
                 (char (*) [163])
                 "Input image \"{}\" has different texcoord origin ({}) than the first image ({}) but will be treated identically as specified by the --assign-texcoord-origin option."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_09,iVar4),&currentGamma,&firstGamma);
    }
    else {
      bVar3 = (this->options).super_OptionsCreate.convertTexcoordOrigin.
              super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
              super__Optional_payload_base<ImageSpec::Origin>._M_engaged;
      pRVar7 = &(this->super_Command).super_Reporter;
      iVar4 = (*currentFile->_vptr_ImageInput[0xd])(currentFile);
      if (bVar3 == true) {
        iVar5 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
        ::toString_abi_cxx11_(&currentGamma,(Origin *)(CONCAT44(extraout_var_12,iVar5) + 0x7c));
        ::toString_abi_cxx11_(&firstGamma,rhs);
        Reporter::
        warning<char_const(&)[203],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (pRVar7,(char (*) [203])
                          "Input image \"{}\" has different texcoord origin ({}) than the first image ({}) and thus will go through different origin conversion to the target origin specified by the --convert-texcoord-origin option."
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(extraout_var_11,iVar4),&currentGamma,&firstGamma);
      }
      else {
        iVar5 = (*currentFile->_vptr_ImageInput[0xe])(currentFile);
        ::toString_abi_cxx11_(&currentGamma,(Origin *)(CONCAT44(extraout_var_13,iVar5) + 0x7c));
        ::toString_abi_cxx11_(&firstGamma,rhs);
        Reporter::
        fatal<char_const(&)[178],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (pRVar7,INVALID_FILE,
                   (char (*) [178])
                   "Input image \"{}\" has different texcoord origin ({}) than the first image ({}). Use --assign-texcoord-origin or --convert-texcoord-origin to specify handling and stop this error."
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(extraout_var_11,iVar4),&currentGamma,&firstGamma);
      }
    }
    std::__cxx11::string::~string((string *)&firstGamma);
    std::__cxx11::string::~string((string *)&currentGamma);
  }
  return;
}

Assistant:

void CommandCreate::checkSpecsMatch(const ImageInput& currentFile, const ImageSpec& firstSpec) {
    const FormatDescriptor& firstFormat = firstSpec.format();
    const FormatDescriptor& currentFormat = currentFile.spec().format();

    if (currentFormat.transfer() != firstFormat.transfer()) {
        if (options.assignTF.has_value()) {
            warning("Input image \"{}\" has different transfer function ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-tf option.",
                currentFile.filename(), toString(currentFormat.transfer()), toString(firstFormat.transfer()));
        } else if (options.convertTF.has_value()) {
            warning("Input image \"{}\" has different transfer function ({}) than the first image ({})"
                " and thus will go through different transfer function conversion to the target transfer"
                " function specified by the --convert-tf option.",
                currentFile.filename(), toString(currentFormat.transfer()), toString(firstFormat.transfer()));
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different transfer function ({}) than the first image ({})."
                " Use --assign-tf or --convert-tf to specify handling and stop this error.",
                currentFile.filename(), toString(currentFormat.transfer()), toString(firstFormat.transfer()));
        }
    }

    if (currentFormat.oeGamma() != firstFormat.oeGamma()) {
        auto currentGamma = currentFormat.oeGamma() != -1 ? std::to_string(currentFormat.oeGamma()) : "no gamma";
        auto firstGamma = firstFormat.oeGamma() != -1 ? std::to_string(firstFormat.oeGamma()) : "no gamma";
        if (options.assignTF.has_value()) {
            warning("Input image \"{}\" has different gamma ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-tf option.",
                currentFile.filename(), currentGamma, firstGamma);
        } else if (options.convertTF.has_value()) {
            warning("Input image \"{}\" has different gamma ({}) than the first image ({})"
                " and thus will go through different transfer function conversion to the target transfer"
                " function specified by the --convert-tf option.",
                currentFile.filename(), currentGamma, firstGamma);
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different gamma ({}) than the first image ({})."
                " Use --assign-tf or --convert-tf to specify handling and stop this error.",
                currentFile.filename(), currentGamma, firstGamma);
        }
    }

    if (currentFormat.primaries() != firstFormat.primaries()) {
        if (options.assignPrimaries.has_value()) {
            warning("Input image \"{}\" has different primaries ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-primaries option.",
                currentFile.filename(), toString(currentFormat.primaries()), toString(firstFormat.primaries()));
        } else if (options.convertPrimaries.has_value()) {
            warning("Input image \"{}\" has different primaries ({}) than the first image ({})"
                " and thus will go through different primaries conversion to the target primaries"
                " specified by the --convert-primaries option.",
                currentFile.filename(), toString(currentFormat.primaries()), toString(firstFormat.primaries()));
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different primaries ({}) than the first image ({})."
                " Use --assign-primaries or --convert-primaries to specify handling and stop this error.",
                currentFile.filename(), toString(currentFormat.primaries()), toString(firstFormat.primaries()));
        }
    }

    if (currentFormat.channelCount() != firstFormat.channelCount()) {
        warning("Input image \"{}\" has a different component count than the first image.", currentFile.filename());
    }

    if (currentFile.spec().origin() != firstSpec.origin()) {
        if (options.assignTexcoordOrigin.has_value()) {
            warning("Input image \"{}\" has different texcoord origin ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-texcoord-origin option.",
                currentFile.filename(), toString(currentFile.spec().origin()), toString(firstSpec.origin()));
        } else if (options.convertTexcoordOrigin.has_value()) {
            warning("Input image \"{}\" has different texcoord origin ({}) than the first image ({})"
                " and thus will go through different origin conversion to the target origin"
                " specified by the --convert-texcoord-origin option.",
                currentFile.filename(), toString(currentFile.spec().origin()), toString(firstSpec.origin()));
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different texcoord origin ({}) than the first image ({})."
                " Use --assign-texcoord-origin or --convert-texcoord-origin to specify handling and stop this error.",
                currentFile.filename(), toString(currentFile.spec().origin()), toString(firstSpec.origin()));
        }
    }
}